

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBMultiFabUtil.cpp
# Opt level: O0

void amrex::EB_average_face_to_cellcenter(MultiFab *ccmf,int dcomp,Array<const_MultiFab_*,_3> *fmf)

{
  double dVar1;
  _func_int *p_Var2;
  bool bVar3;
  FabType FVar4;
  FabFactory<amrex::FArrayBox> *pFVar5;
  FabArrayBase *fabarray_;
  MFItInfo *this;
  int in_ESI;
  int i_2;
  int j_2;
  int k_2;
  Dim3 amrex_i_hi_2;
  Dim3 amrex_i_lo_2;
  Array4<const_amrex::EBCellFlag> *flagarr;
  Array4<const_double> *apz;
  Array4<const_double> *apy;
  Array4<const_double> *apx;
  int i_1;
  int j_1;
  int k_1;
  Dim3 amrex_i_hi_1;
  Dim3 amrex_i_lo_1;
  int i;
  int j;
  int k;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  FabType fabtyp;
  Array4<const_double> *zfab;
  Array4<const_double> *yfab;
  Array4<const_double> *xfab;
  Array4<double> *ccfab;
  EBCellFlagFab *flagfab;
  Box *bx;
  MFIter mfi;
  MFItInfo info;
  Array<const_MultiCutFab_*,_3> *area;
  FabArray<amrex::EBCellFlagFab> *flags;
  EBFArrayBoxFactory *factory;
  MFIter *in_stack_fffffffffffff418;
  MultiCutFab *in_stack_fffffffffffff420;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff428;
  FabArray<amrex::FArrayBox> *pFVar6;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffff430;
  MFItInfo *in_stack_fffffffffffff440;
  Array4<const_amrex::EBCellFlag> *this_00;
  MFIter *in_stack_fffffffffffff450;
  int local_b9c;
  int local_b98;
  int local_b94;
  undefined4 in_stack_fffffffffffff480;
  int in_stack_fffffffffffff484;
  Array4<const_amrex::EBCellFlag> local_b50;
  Array4<const_amrex::EBCellFlag> *local_b10;
  long local_b08 [8];
  long *local_ac8;
  Box *in_stack_fffffffffffff540;
  EBCellFlagFab *in_stack_fffffffffffff548;
  undefined8 local_a38;
  undefined4 local_a2c;
  int local_a28;
  int local_a24;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a20;
  int local_a18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0c;
  int local_a04;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a00;
  int local_9f8;
  RefID local_9f0;
  int local_9e8;
  int local_9e4;
  int local_9e0;
  int local_9dc;
  undefined8 local_9d8;
  int local_9d0;
  int in_stack_fffffffffffff63c;
  undefined4 in_stack_fffffffffffff640;
  undefined4 in_stack_fffffffffffff644;
  pointer in_stack_fffffffffffff648;
  int iVar7;
  int in_stack_fffffffffffff650;
  int in_stack_fffffffffffff654;
  undefined1 local_998 [144];
  long local_908 [8];
  long *local_8c8;
  long local_8c0 [8];
  long *local_880;
  EBCellFlagFab *local_878;
  int local_86c [7];
  int *local_850;
  MFIter local_848;
  MFItInfo local_7e4;
  undefined1 local_7d0 [24];
  undefined1 *local_7b8;
  FabArray<amrex::EBCellFlagFab> *local_7b0;
  FabArrayBase *local_7a8;
  int local_794;
  undefined8 local_788;
  int local_780;
  int *local_778;
  int local_76c;
  int iStack_768;
  int local_764;
  BARef *local_760;
  int local_758;
  int *local_750;
  int local_744;
  int iStack_740;
  int local_73c;
  undefined8 local_738;
  int local_730;
  int *local_728;
  int local_71c;
  int iStack_718;
  int local_714;
  undefined8 local_710;
  int local_708;
  int *local_700;
  int local_6f4;
  int iStack_6f0;
  int local_6ec;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_6e8;
  int local_6e0;
  int *local_6d8;
  int local_6cc;
  int iStack_6c8;
  int local_6c4;
  undefined8 local_6c0;
  int local_6b8;
  int *local_6b0;
  int local_6a4;
  int iStack_6a0;
  int local_69c;
  int local_694;
  int local_690;
  int local_68c;
  long *local_688;
  EBCellFlagFab *local_680;
  FBData<amrex::FArrayBox> *local_670;
  FBData<amrex::CutFab> *local_668;
  long *local_660;
  long *local_658;
  int local_64c;
  int local_648;
  int local_644;
  int local_640;
  int local_63c;
  int local_638;
  int local_634;
  long *local_630;
  int local_628;
  int local_624;
  int local_620;
  int local_61c;
  long *local_618;
  int local_60c;
  int local_608;
  int local_604;
  long *local_600;
  int local_5f4;
  int local_5f0;
  int local_5ec;
  FBData<amrex::FArrayBox> *local_5e8;
  int local_5dc;
  int local_5d8;
  int local_5d4;
  FBData<amrex::FArrayBox> *local_5d0;
  int local_5c4;
  int local_5c0;
  int local_5bc;
  FBData<amrex::CutFab> *local_5b8;
  int local_5ac;
  int local_5a8;
  int local_5a4;
  FBData<amrex::CutFab> *local_5a0;
  int local_594;
  int local_590;
  int local_58c;
  long *local_588;
  int local_57c;
  int local_578;
  int local_574;
  long *local_570;
  Array4<const_amrex::EBCellFlag> *local_568;
  long *local_560;
  FabArray<amrex::FArrayBox> *local_558;
  MultiCutFab *local_550;
  _Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false> local_548;
  _Head_base<0UL,_amrex::FBData<amrex::CutFab>_*,_false> local_540;
  long *local_538;
  long *local_530;
  int local_520;
  int local_51c;
  int local_518;
  int local_514;
  int local_510;
  int local_50c;
  Array4<const_amrex::EBCellFlag> *local_508;
  EBCellFlag *local_500;
  int local_4f8;
  int local_4f4;
  int local_4f0;
  int local_4ec;
  long *local_4e8;
  int local_4e0;
  int local_4dc;
  int local_4d8;
  int local_4d4;
  long *local_4d0;
  int local_4c8;
  int local_4c4;
  int local_4c0;
  int local_4bc;
  long *local_4b8;
  int local_4b0;
  int local_4ac;
  int local_4a8;
  int local_4a4;
  long *local_4a0;
  int local_498;
  int local_494;
  int local_490;
  int local_48c;
  long *local_488;
  int local_480;
  int local_47c;
  int local_478;
  int local_474;
  long *local_470;
  int local_468;
  int local_464;
  int local_460;
  int local_45c;
  long *local_458;
  int local_450;
  int local_44c;
  int local_448;
  int local_444;
  long *local_440;
  int local_438;
  int local_434;
  int local_430;
  int local_42c;
  long *local_428;
  int local_420;
  int local_41c;
  int local_418;
  int local_414;
  long *local_410;
  int local_408;
  int local_404;
  int local_400;
  int local_3fc;
  long *local_3f8;
  int local_3f0;
  int local_3ec;
  int local_3e8;
  int local_3e4;
  long *local_3e0;
  int local_3d4;
  int local_3d0;
  int local_3cc;
  FBData<amrex::FArrayBox> *local_3c8;
  int local_3bc;
  int local_3b8;
  int local_3b4;
  FBData<amrex::FArrayBox> *local_3b0;
  int local_3a4;
  int local_3a0;
  int local_39c;
  FBData<amrex::FArrayBox> *local_398;
  int local_38c;
  int local_388;
  int local_384;
  long *local_380;
  int local_374;
  int local_370;
  int local_36c;
  FBData<amrex::FArrayBox> *local_368;
  int local_35c;
  int local_358;
  int local_354;
  long *local_350;
  int local_344;
  int local_340;
  int local_33c;
  FBData<amrex::CutFab> *local_338;
  int local_32c;
  int local_328;
  int local_324;
  FBData<amrex::CutFab> *local_320;
  int local_314;
  int local_310;
  int local_30c;
  FBData<amrex::CutFab> *local_308;
  int local_2fc;
  int local_2f8;
  int local_2f4;
  FabArray<amrex::FArrayBox> *local_2f0;
  int local_2e4;
  int local_2e0;
  int local_2dc;
  FBData<amrex::CutFab> *local_2d8;
  int local_2cc;
  int local_2c8;
  int local_2c4;
  FabArray<amrex::FArrayBox> *local_2c0;
  int local_2b4;
  int local_2b0;
  int local_2ac;
  long *local_2a8;
  int local_29c;
  int local_298;
  int local_294;
  long *local_290;
  int local_284;
  int local_280;
  int local_27c;
  long *local_278;
  int local_26c;
  int local_268;
  int local_264;
  MultiCutFab *local_260;
  int local_254;
  int local_250;
  int local_24c;
  long *local_248;
  int local_23c;
  int local_238;
  int local_234;
  MultiCutFab *local_230;
  undefined4 local_224;
  int *local_220;
  undefined4 local_214;
  int *local_210;
  undefined4 local_204;
  int *local_200;
  undefined4 local_1f4;
  int *local_1f0;
  undefined4 local_1e4;
  int *local_1e0;
  undefined4 local_1d4;
  int *local_1d0;
  undefined4 local_1c4;
  int *local_1c0;
  undefined4 local_1b4;
  int *local_1b0;
  undefined4 local_1a4;
  int *local_1a0;
  undefined4 local_194;
  int *local_190;
  undefined4 local_184;
  int *local_180;
  undefined4 local_174;
  int *local_170;
  undefined4 local_164;
  int *local_160;
  undefined4 local_154;
  int *local_150;
  undefined4 local_144;
  int *local_140;
  undefined4 local_134;
  int *local_130;
  undefined4 local_124;
  int *local_120;
  undefined4 local_114;
  int *local_110;
  Dim3 local_108;
  Dim3 local_f8;
  Dim3 local_e8;
  Dim3 local_d8;
  int local_cc;
  Box *local_c8;
  EBCellFlag *local_c0;
  Dim3 local_b8;
  Box *local_a8;
  int local_a0;
  int iStack_9c;
  int local_98;
  undefined4 local_94;
  Box *local_90;
  undefined4 local_84;
  Box *local_80;
  undefined4 local_74;
  Box *local_70;
  Dim3 local_68;
  Box *local_58;
  int local_50;
  int iStack_4c;
  int local_48;
  undefined4 local_44;
  IntVect *local_40;
  undefined4 local_34;
  IntVect *local_30;
  undefined4 local_24;
  IntVect *local_20;
  
  iVar7 = (int)((ulong)in_stack_fffffffffffff648 >> 0x20);
  local_794 = in_ESI;
  std::array<const_amrex::MultiFab_*,_3UL>::operator[]
            ((array<const_amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffff420,
             (size_type)in_stack_fffffffffffff418);
  bVar3 = FabArray<amrex::FArrayBox>::hasEBFabFactory(in_stack_fffffffffffff430);
  if (bVar3) {
    std::array<const_amrex::MultiFab_*,_3UL>::operator[]
              ((array<const_amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffff420,
               (size_type)in_stack_fffffffffffff418);
    pFVar5 = FabArray<amrex::FArrayBox>::Factory((FabArray<amrex::FArrayBox> *)0x115798b);
    fabarray_ = (FabArrayBase *)
                __dynamic_cast(pFVar5,&FabFactory<amrex::FArrayBox>::typeinfo,
                               &EBFArrayBoxFactory::typeinfo,0);
    if (fabarray_ == (FabArrayBase *)0x0) {
      __cxa_bad_cast();
    }
    local_7a8 = fabarray_;
    local_7b0 = EBFArrayBoxFactory::getMultiEBCellFlagFab
                          ((EBFArrayBoxFactory *)in_stack_fffffffffffff420);
    EBFArrayBoxFactory::getAreaFrac((EBFArrayBoxFactory *)in_stack_fffffffffffff420);
    local_7b8 = local_7d0;
    MFItInfo::MFItInfo((MFItInfo *)in_stack_fffffffffffff430);
    this = MFItInfo::EnableTiling(&local_7e4,(IntVect *)&FabArrayBase::mfiter_tile_size);
    MFItInfo::SetDynamic(this,true);
    MFIter::MFIter(in_stack_fffffffffffff450,fabarray_,in_stack_fffffffffffff440);
    while (bVar3 = MFIter::isValid(&local_848), bVar3) {
      MFIter::tilebox((MFIter *)CONCAT44(in_stack_fffffffffffff484,in_stack_fffffffffffff480));
      local_850 = local_86c;
      local_878 = FabArray<amrex::EBCellFlagFab>::operator[]
                            ((FabArray<amrex::EBCellFlagFab> *)in_stack_fffffffffffff420,
                             in_stack_fffffffffffff418);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_fffffffffffff428,(MFIter *)in_stack_fffffffffffff420);
      local_880 = local_8c0;
      std::array<const_amrex::MultiFab_*,_3UL>::operator[]
                ((array<const_amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffff420,
                 (size_type)in_stack_fffffffffffff418);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (in_stack_fffffffffffff428,(MFIter *)in_stack_fffffffffffff420);
      local_8c8 = local_908;
      std::array<const_amrex::MultiFab_*,_3UL>::operator[]
                ((array<const_amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffff420,
                 (size_type)in_stack_fffffffffffff418);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (in_stack_fffffffffffff428,(MFIter *)in_stack_fffffffffffff420);
      local_998._136_8_ = (long)local_998 + 0x48;
      std::array<const_amrex::MultiFab_*,_3UL>::operator[]
                ((array<const_amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffff420,
                 (size_type)in_stack_fffffffffffff418);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (in_stack_fffffffffffff428,(MFIter *)in_stack_fffffffffffff420);
      local_998._64_8_ = local_998;
      FVar4 = EBCellFlagFab::getType(in_stack_fffffffffffff548,in_stack_fffffffffffff540);
      if (FVar4 == covered) {
        local_728 = local_850;
        local_170 = local_850;
        local_174 = 0;
        local_71c = *local_850;
        local_180 = local_850;
        local_184 = 1;
        iStack_718 = local_850[1];
        local_738 = *(undefined8 *)local_850;
        local_190 = local_850;
        local_194 = 2;
        local_730 = local_850[2];
        local_6b0 = local_850;
        local_200 = local_850 + 3;
        local_204 = 0;
        local_6a4 = *local_200;
        local_210 = local_850 + 3;
        local_214 = 1;
        iStack_6a0 = local_850[4];
        local_9d8._0_4_ = local_200[0];
        local_9d8._4_4_ = local_200[1];
        local_220 = local_850 + 3;
        local_224 = 2;
        local_9d0 = local_850[5];
        for (local_9dc = local_730; iVar7 = iStack_718, local_714 = local_730, local_6c0 = local_9d8
            , local_6b8 = local_9d0, local_69c = local_9d0, local_9dc <= local_9d0;
            local_9dc = local_9dc + 1) {
          while (local_9e0 = iVar7, iVar7 = local_71c, local_9e0 <= iStack_6a0) {
            while (local_9e4 = iVar7, local_9e4 <= local_6a4) {
              local_688 = local_880;
              local_68c = local_9e4;
              local_690 = local_9e0;
              local_694 = local_9dc;
              *(undefined8 *)
               (*local_880 +
               ((long)(local_9e4 - (int)local_880[4]) +
                (long)(local_9e0 - *(int *)((long)local_880 + 0x24)) * local_880[1] +
                (long)(local_9dc - (int)local_880[5]) * local_880[2] +
               (long)local_794 * local_880[3]) * 8) = 0;
              iVar7 = local_9e4 + 1;
            }
            iVar7 = local_9e0 + 1;
          }
        }
      }
      else if (FVar4 == regular) {
        local_750 = local_850;
        local_140 = local_850;
        local_144 = 0;
        local_744 = *local_850;
        local_150 = local_850;
        local_154 = 1;
        iStack_740 = local_850[1];
        local_a00._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_850;
        local_160 = local_850;
        local_164 = 2;
        local_9f8 = local_850[2];
        local_6d8 = local_850;
        local_1d0 = local_850 + 3;
        local_1d4 = 0;
        local_6cc = *local_1d0;
        local_1e0 = local_850 + 3;
        local_1e4 = 1;
        iStack_6c8 = local_850[4];
        local_a20._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_1d0;
        local_1f0 = local_850 + 3;
        local_1f4 = 2;
        local_a18 = local_850[5];
        for (local_a24 = local_9f8; iVar7 = iStack_740, local_a0c = local_a20._M_pi,
            local_a04 = local_a18, local_9f0.data = (BARef *)local_a00._M_pi, local_9e8 = local_9f8,
            local_760 = (BARef *)local_a00._M_pi, local_758 = local_9f8, local_73c = local_9f8,
            local_6e8 = local_a20._M_pi, local_6e0 = local_a18, local_6c4 = local_a18,
            local_a24 <= local_a18; local_a24 = local_a24 + 1) {
          while (local_a28 = iVar7, iVar7 = local_744, local_a28 <= iStack_6c8) {
            while (local_a2c = iVar7, (int)local_a2c <= local_6cc) {
              local_644 = local_a2c;
              local_648 = local_a28;
              local_64c = local_a24;
              local_658 = local_880;
              local_660 = local_8c8;
              local_668 = (FBData<amrex::CutFab> *)local_998._136_8_;
              local_670 = (FBData<amrex::FArrayBox> *)local_998._64_8_;
              local_570 = local_8c8;
              local_574 = local_a2c;
              local_578 = local_a28;
              local_57c = local_a24;
              local_588 = local_8c8;
              local_58c = local_a2c + 1;
              local_590 = local_a28;
              local_594 = local_a24;
              local_600 = local_880;
              local_604 = local_a2c;
              local_608 = local_a28;
              local_60c = local_a24;
              *(double *)
               (*local_880 +
               ((long)(local_a2c - (int)local_880[4]) +
                (long)(local_a28 - *(int *)((long)local_880 + 0x24)) * local_880[1] +
                (long)(local_a24 - (int)local_880[5]) * local_880[2] +
               (long)local_794 * local_880[3]) * 8) =
                   (*(double *)
                     (*local_8c8 +
                     ((long)(local_a2c - (int)local_8c8[4]) +
                      (long)(local_a28 - *(int *)((long)local_8c8 + 0x24)) * local_8c8[1] +
                     (long)(local_a24 - (int)local_8c8[5]) * local_8c8[2]) * 8) +
                   *(double *)
                    (*local_8c8 +
                    ((long)(local_58c - (int)local_8c8[4]) +
                     (long)(local_a28 - *(int *)((long)local_8c8 + 0x24)) * local_8c8[1] +
                    (long)(local_a24 - (int)local_8c8[5]) * local_8c8[2]) * 8)) * 0.5;
              local_5a0 = (FBData<amrex::CutFab> *)local_998._136_8_;
              local_5a4 = local_a2c;
              local_5a8 = local_a28;
              local_5ac = local_a24;
              local_5b8 = (FBData<amrex::CutFab> *)local_998._136_8_;
              local_5bc = local_a2c;
              local_5c0 = local_a28 + 1;
              local_5c4 = local_a24;
              local_618 = local_880;
              local_61c = local_a2c;
              local_620 = local_a28;
              local_624 = local_a24;
              local_628 = local_794 + 1;
              *(double *)
               (*local_880 +
               ((long)(local_a2c - (int)local_880[4]) +
                (long)(local_a28 - *(int *)((long)local_880 + 0x24)) * local_880[1] +
                (long)(local_a24 - (int)local_880[5]) * local_880[2] +
               (long)local_628 * local_880[3]) * 8) =
                   (*(double *)
                     (&(((FB *)(&(*(FB **)local_998._136_8_)->m_crse_ratio + -3))->
                       super_CommMetaData).m_threadsafe_loc +
                     ((long)(local_a2c -
                            *(int *)&(((Vector<int,_std::allocator<int>_> *)
                                      (local_998._136_8_ + 0x20))->
                                     super_vector<int,_std::allocator<int>_>).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start) +
                      (long)(local_a28 -
                            *(int *)((long)&(((Vector<int,_std::allocator<int>_> *)
                                             (local_998._136_8_ + 0x20))->
                                            super_vector<int,_std::allocator<int>_>).
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start + 4)) *
                      *(long *)(local_998._136_8_ + 8) +
                     (long)(local_a24 -
                           *(int *)&(((Vector<int,_std::allocator<int>_> *)
                                     (local_998._136_8_ + 0x20))->
                                    super_vector<int,_std::allocator<int>_>).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish) *
                     (long)*(char **)(local_998._136_8_ + 0x10)) * 8) +
                   *(double *)
                    (&(((FB *)(&(*(FB **)local_998._136_8_)->m_crse_ratio + -3))->super_CommMetaData
                      ).m_threadsafe_loc +
                    ((long)(local_a2c -
                           *(int *)&(((Vector<int,_std::allocator<int>_> *)
                                     (local_998._136_8_ + 0x20))->
                                    super_vector<int,_std::allocator<int>_>).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start) +
                     (long)(local_5c0 -
                           *(int *)((long)&(((Vector<int,_std::allocator<int>_> *)
                                            (local_998._136_8_ + 0x20))->
                                           super_vector<int,_std::allocator<int>_>).
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_start + 4)) *
                     *(long *)(local_998._136_8_ + 8) +
                    (long)(local_a24 -
                          *(int *)&(((Vector<int,_std::allocator<int>_> *)(local_998._136_8_ + 0x20)
                                    )->super_vector<int,_std::allocator<int>_>).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish) *
                    (long)*(char **)(local_998._136_8_ + 0x10)) * 8)) * 0.5;
              local_5d0 = (FBData<amrex::FArrayBox> *)local_998._64_8_;
              local_5d4 = local_a2c;
              local_5d8 = local_a28;
              local_5dc = local_a24;
              local_5e8 = (FBData<amrex::FArrayBox> *)local_998._64_8_;
              local_5ec = local_a2c;
              local_5f0 = local_a28;
              local_5f4 = local_a24 + 1;
              local_630 = local_880;
              local_634 = local_a2c;
              local_638 = local_a28;
              local_63c = local_a24;
              local_640 = local_794 + 2;
              *(double *)
               (*local_880 +
               ((long)(local_a2c - (int)local_880[4]) +
                (long)(local_a28 - *(int *)((long)local_880 + 0x24)) * local_880[1] +
                (long)(local_a24 - (int)local_880[5]) * local_880[2] +
               (long)local_640 * local_880[3]) * 8) =
                   (*(double *)
                     (&(((FB *)(&(*(FB **)local_998._64_8_)->m_crse_ratio + -3))->super_CommMetaData
                       ).m_threadsafe_loc +
                     ((long)(local_a2c -
                            *(int *)&(((Vector<int,_std::allocator<int>_> *)
                                      (local_998._64_8_ + 0x20))->
                                     super_vector<int,_std::allocator<int>_>).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start) +
                      (long)(local_a28 -
                            *(int *)((long)&(((Vector<int,_std::allocator<int>_> *)
                                             (local_998._64_8_ + 0x20))->
                                            super_vector<int,_std::allocator<int>_>).
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start + 4)) *
                      *(long *)(local_998._64_8_ + 8) +
                     (long)(local_a24 -
                           *(int *)&(((Vector<int,_std::allocator<int>_> *)(local_998._64_8_ + 0x20)
                                     )->super_vector<int,_std::allocator<int>_>).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish) *
                     (long)*(char **)(local_998._64_8_ + 0x10)) * 8) +
                   *(double *)
                    (&(((FB *)(&(*(FB **)local_998._64_8_)->m_crse_ratio + -3))->super_CommMetaData)
                      .m_threadsafe_loc +
                    ((long)(local_a2c -
                           *(int *)&(((Vector<int,_std::allocator<int>_> *)(local_998._64_8_ + 0x20)
                                     )->super_vector<int,_std::allocator<int>_>).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start) +
                     (long)(local_a28 -
                           *(int *)((long)&(((Vector<int,_std::allocator<int>_> *)
                                            (local_998._64_8_ + 0x20))->
                                           super_vector<int,_std::allocator<int>_>).
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_start + 4)) *
                     *(long *)(local_998._64_8_ + 8) +
                    (long)(local_5f4 -
                          *(int *)&(((Vector<int,_std::allocator<int>_> *)(local_998._64_8_ + 0x20))
                                   ->super_vector<int,_std::allocator<int>_>).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish) *
                    (long)*(char **)(local_998._64_8_ + 0x10)) * 8)) * 0.5;
              iVar7 = local_a2c + 1;
            }
            iVar7 = local_a28 + 1;
          }
        }
      }
      else {
        std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                  ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffff420,
                   (size_type)in_stack_fffffffffffff418);
        in_stack_fffffffffffff420 = (MultiCutFab *)&stack0xfffffffffffff588;
        MultiCutFab::const_array(in_stack_fffffffffffff420,in_stack_fffffffffffff418);
        local_a38 = in_stack_fffffffffffff420;
        std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                  ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffff420,
                   (size_type)in_stack_fffffffffffff418);
        pFVar6 = (FabArray<amrex::FArrayBox> *)&stack0xfffffffffffff540;
        MultiCutFab::const_array(in_stack_fffffffffffff420,in_stack_fffffffffffff418);
        in_stack_fffffffffffff428 = pFVar6;
        std::array<const_amrex::MultiCutFab_*,_3UL>::operator[]
                  ((array<const_amrex::MultiCutFab_*,_3UL> *)in_stack_fffffffffffff420,
                   (size_type)in_stack_fffffffffffff418);
        MultiCutFab::const_array(in_stack_fffffffffffff420,in_stack_fffffffffffff418);
        local_680 = local_878;
        local_c0 = (local_878->super_BaseFab<amrex::EBCellFlag>).dptr;
        local_c8 = &(local_878->super_BaseFab<amrex::EBCellFlag>).domain;
        local_cc = (local_878->super_BaseFab<amrex::EBCellFlag>).nvar;
        local_74 = 0;
        local_a0 = (local_c8->smallend).vect[0];
        local_84 = 1;
        iStack_9c = (local_878->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1];
        local_e8.x = (local_c8->smallend).vect[0];
        local_e8.y = (local_c8->smallend).vect[1];
        local_94 = 2;
        local_e8.z = (local_878->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
        local_20 = &(local_878->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
        local_24 = 0;
        local_50 = local_20->vect[0] + 1;
        local_30 = &(local_878->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
        local_34 = 1;
        iStack_4c = (local_878->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] + 1;
        local_40 = &(local_878->super_BaseFab<amrex::EBCellFlag>).domain.bigend;
        local_44 = 2;
        local_108.z = (local_878->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[2] + 1;
        local_108.y = iStack_4c;
        local_108.x = local_50;
        this_00 = &local_b50;
        local_ac8 = local_b08;
        local_f8._0_8_ = local_108._0_8_;
        local_f8.z = local_108.z;
        local_d8._0_8_ = local_e8._0_8_;
        local_d8.z = local_e8.z;
        local_b8._0_8_ = local_e8._0_8_;
        local_b8.z = local_e8.z;
        local_a8 = local_c8;
        local_98 = local_e8.z;
        local_90 = local_c8;
        local_80 = local_c8;
        local_70 = local_c8;
        local_68._0_8_ = local_108._0_8_;
        local_68.z = local_108.z;
        local_58 = local_c8;
        local_48 = local_108.z;
        Array4<const_amrex::EBCellFlag>::Array4(this_00,local_c0,&local_d8,&local_f8,local_cc);
        local_778 = local_850;
        local_110 = local_850;
        local_114 = 0;
        local_76c = *local_850;
        local_120 = local_850;
        local_124 = 1;
        iStack_768 = local_850[1];
        local_788 = *(undefined8 *)local_850;
        local_130 = local_850;
        local_134 = 2;
        local_780 = local_850[2];
        local_700 = local_850;
        local_1a0 = local_850 + 3;
        local_1a4 = 0;
        in_stack_fffffffffffff484 = *local_1a0;
        local_1b0 = local_850 + 3;
        local_1b4 = 1;
        iStack_6f0 = local_850[4];
        local_710 = *(undefined8 *)local_1a0;
        local_1c0 = local_850 + 3;
        local_1c4 = 2;
        local_708 = local_850[5];
        for (local_b94 = local_780; local_b98 = iStack_768, local_b10 = this_00,
            local_764 = local_780, local_6f4 = in_stack_fffffffffffff484, local_6ec = local_708,
            local_b94 <= local_708; local_b94 = local_b94 + 1) {
          for (; local_b9c = local_76c, local_b98 <= iStack_6f0; local_b98 = local_b98 + 1) {
            for (; local_b9c <= in_stack_fffffffffffff484; local_b9c = local_b9c + 1) {
              local_518 = local_b9c;
              local_51c = local_b98;
              local_520 = local_b94;
              local_530 = local_880;
              local_538 = local_8c8;
              local_540._M_head_impl = (FBData<amrex::CutFab> *)local_998._136_8_;
              local_548._M_head_impl = (FBData<amrex::FArrayBox> *)local_998._64_8_;
              local_550 = (MultiCutFab *)local_a38;
              local_560 = local_ac8;
              local_50c = local_b9c;
              local_510 = local_b98;
              local_514 = local_b94;
              local_500 = this_00->p +
                          (long)(local_b9c - (this_00->begin).x) +
                          (long)(local_b98 - (this_00->begin).y) * this_00->jstride +
                          (long)(local_b94 - (this_00->begin).z) * this_00->kstride;
              if ((local_500->flag & 3) == 3) {
                local_3e0 = local_880;
                local_3e4 = local_b9c;
                local_3e8 = local_b98;
                local_3ec = local_b94;
                local_3f0 = local_794;
                *(undefined8 *)
                 (*local_880 +
                 ((long)(local_b9c - (int)local_880[4]) +
                  (long)(local_b98 - *(int *)((long)local_880 + 0x24)) * local_880[1] +
                  (long)(local_b94 - (int)local_880[5]) * local_880[2] +
                 (long)local_794 * local_880[3]) * 8) = 0;
                local_408 = local_794 + 1;
                local_3f8 = local_880;
                local_3fc = local_b9c;
                local_400 = local_b98;
                local_404 = local_b94;
                *(undefined8 *)
                 (*local_880 +
                 ((long)(local_b9c - (int)local_880[4]) +
                  (long)(local_b98 - *(int *)((long)local_880 + 0x24)) * local_880[1] +
                  (long)(local_b94 - (int)local_880[5]) * local_880[2] +
                 (long)local_408 * local_880[3]) * 8) = 0;
                local_420 = local_794 + 2;
                local_410 = local_880;
                local_414 = local_b9c;
                local_418 = local_b98;
                local_41c = local_b94;
                *(undefined8 *)
                 (*local_880 +
                 ((long)(local_b9c - (int)local_880[4]) +
                  (long)(local_b98 - *(int *)((long)local_880 + 0x24)) * local_880[1] +
                  (long)(local_b94 - (int)local_880[5]) * local_880[2] +
                 (long)local_420 * local_880[3]) * 8) = 0;
              }
              else {
                local_230 = (MultiCutFab *)local_a38;
                local_234 = local_b9c;
                local_238 = local_b98;
                local_23c = local_b94;
                dVar1 = *(double *)
                         (*(long *)local_a38 +
                         ((long)(local_b9c - *(int *)(local_a38 + 0x20)) +
                          (long)(local_b98 - *(int *)(local_a38 + 0x24)) *
                          *(long *)&((BoxArray *)(local_a38 + 8))->m_bat +
                         (long)(local_b94 - *(int *)(local_a38 + 0x28)) *
                         *(long *)(local_a38 + 0x10)) * 8);
                if ((dVar1 != 0.0) || (NAN(dVar1))) {
                  local_264 = local_b9c + 1;
                  local_260 = (MultiCutFab *)local_a38;
                  local_268 = local_b98;
                  local_26c = local_b94;
                  dVar1 = *(double *)
                           (*(long *)local_a38 +
                           ((long)(local_264 - *(int *)(local_a38 + 0x20)) +
                            (long)(local_b98 - *(int *)(local_a38 + 0x24)) *
                            *(long *)&((BoxArray *)(local_a38 + 8))->m_bat +
                           (long)(local_b94 - *(int *)(local_a38 + 0x28)) *
                           *(long *)(local_a38 + 0x10)) * 8);
                  if ((dVar1 != 0.0) || (NAN(dVar1))) {
                    local_290 = local_8c8;
                    local_294 = local_b9c;
                    local_298 = local_b98;
                    local_29c = local_b94;
                    local_2ac = local_b9c + 1;
                    local_2a8 = local_8c8;
                    local_2b0 = local_b98;
                    local_2b4 = local_b94;
                    local_458 = local_880;
                    local_45c = local_b9c;
                    local_460 = local_b98;
                    local_464 = local_b94;
                    local_468 = local_794;
                    *(double *)
                     (*local_880 +
                     ((long)(local_b9c - (int)local_880[4]) +
                      (long)(local_b98 - *(int *)((long)local_880 + 0x24)) * local_880[1] +
                      (long)(local_b94 - (int)local_880[5]) * local_880[2] +
                     (long)local_794 * local_880[3]) * 8) =
                         (*(double *)
                           (*local_8c8 +
                           ((long)(local_b9c - (int)local_8c8[4]) +
                            (long)(local_b98 - *(int *)((long)local_8c8 + 0x24)) * local_8c8[1] +
                           (long)(local_b94 - (int)local_8c8[5]) * local_8c8[2]) * 8) +
                         *(double *)
                          (*local_8c8 +
                          ((long)(local_2ac - (int)local_8c8[4]) +
                           (long)(local_b98 - *(int *)((long)local_8c8 + 0x24)) * local_8c8[1] +
                          (long)(local_b94 - (int)local_8c8[5]) * local_8c8[2]) * 8)) * 0.5;
                  }
                  else {
                    local_278 = local_8c8;
                    local_27c = local_b9c;
                    local_280 = local_b98;
                    local_284 = local_b94;
                    local_440 = local_880;
                    local_444 = local_b9c;
                    local_448 = local_b98;
                    local_44c = local_b94;
                    local_450 = local_794;
                    *(undefined8 *)
                     (*local_880 +
                     ((long)(local_b9c - (int)local_880[4]) +
                      (long)(local_b98 - *(int *)((long)local_880 + 0x24)) * local_880[1] +
                      (long)(local_b94 - (int)local_880[5]) * local_880[2] +
                     (long)local_794 * local_880[3]) * 8) =
                         *(undefined8 *)
                          (*local_8c8 +
                          ((long)(local_b9c - (int)local_8c8[4]) +
                           (long)(local_b98 - *(int *)((long)local_8c8 + 0x24)) * local_8c8[1] +
                          (long)(local_b94 - (int)local_8c8[5]) * local_8c8[2]) * 8);
                  }
                }
                else {
                  local_24c = local_b9c + 1;
                  local_248 = local_8c8;
                  local_250 = local_b98;
                  local_254 = local_b94;
                  local_428 = local_880;
                  local_42c = local_b9c;
                  local_430 = local_b98;
                  local_434 = local_b94;
                  local_438 = local_794;
                  *(undefined8 *)
                   (*local_880 +
                   ((long)(local_b9c - (int)local_880[4]) +
                    (long)(local_b98 - *(int *)((long)local_880 + 0x24)) * local_880[1] +
                    (long)(local_b94 - (int)local_880[5]) * local_880[2] +
                   (long)local_794 * local_880[3]) * 8) =
                       *(undefined8 *)
                        (*local_8c8 +
                        ((long)(local_24c - (int)local_8c8[4]) +
                         (long)(local_b98 - *(int *)((long)local_8c8 + 0x24)) * local_8c8[1] +
                        (long)(local_b94 - (int)local_8c8[5]) * local_8c8[2]) * 8);
                }
                local_2c4 = local_b9c;
                local_2c8 = local_b98;
                local_2cc = local_b94;
                p_Var2 = (pFVar6->super_FabArrayBase)._vptr_FabArrayBase
                         [(long)(local_b9c -
                                (pFVar6->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg.m_loshft
                                .vect[0]) +
                          (long)(local_b98 -
                                (pFVar6->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg.m_loshft
                                .vect[1]) * *(long *)&(pFVar6->super_FabArrayBase).boxarray.m_bat +
                          (long)(local_b94 -
                                (pFVar6->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg.m_loshft
                                .vect[2]) *
                          *(long *)((long)&(pFVar6->super_FabArrayBase).boxarray.m_bat.m_op + 4)];
                if (((double)p_Var2 != 0.0) || (NAN((double)p_Var2))) {
                  local_2f8 = local_b98 + 1;
                  local_2f4 = local_b9c;
                  local_2fc = local_b94;
                  p_Var2 = (pFVar6->super_FabArrayBase)._vptr_FabArrayBase
                           [(long)(local_b9c -
                                  (pFVar6->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg.
                                  m_loshft.vect[0]) +
                            (long)(local_2f8 -
                                  (pFVar6->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg.
                                  m_loshft.vect[1]) *
                            *(long *)&(pFVar6->super_FabArrayBase).boxarray.m_bat +
                            (long)(local_b94 -
                                  (pFVar6->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg.
                                  m_loshft.vect[2]) *
                            *(long *)((long)&(pFVar6->super_FabArrayBase).boxarray.m_bat.m_op + 4)];
                  local_2f0 = pFVar6;
                  if (((double)p_Var2 != 0.0) || (NAN((double)p_Var2))) {
                    local_320 = (FBData<amrex::CutFab> *)local_998._136_8_;
                    local_324 = local_b9c;
                    local_328 = local_b98;
                    local_32c = local_b94;
                    local_340 = local_b98 + 1;
                    local_338 = (FBData<amrex::CutFab> *)local_998._136_8_;
                    local_33c = local_b9c;
                    local_344 = local_b94;
                    local_4b0 = local_794 + 1;
                    local_4a0 = local_880;
                    local_4a4 = local_b9c;
                    local_4a8 = local_b98;
                    local_4ac = local_b94;
                    *(double *)
                     (*local_880 +
                     ((long)(local_b9c - (int)local_880[4]) +
                      (long)(local_b98 - *(int *)((long)local_880 + 0x24)) * local_880[1] +
                      (long)(local_b94 - (int)local_880[5]) * local_880[2] +
                     (long)local_4b0 * local_880[3]) * 8) =
                         (*(double *)
                           (&(((FB *)(&(*(FB **)local_998._136_8_)->m_crse_ratio + -3))->
                             super_CommMetaData).m_threadsafe_loc +
                           ((long)(local_b9c -
                                  *(int *)&(((Vector<int,_std::allocator<int>_> *)
                                            (local_998._136_8_ + 0x20))->
                                           super_vector<int,_std::allocator<int>_>).
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_start) +
                            (long)(local_b98 -
                                  *(int *)((long)&(((Vector<int,_std::allocator<int>_> *)
                                                   (local_998._136_8_ + 0x20))->
                                                  super_vector<int,_std::allocator<int>_>).
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + 4)) *
                            *(long *)(local_998._136_8_ + 8) +
                           (long)(local_b94 -
                                 *(int *)&(((Vector<int,_std::allocator<int>_> *)
                                           (local_998._136_8_ + 0x20))->
                                          super_vector<int,_std::allocator<int>_>).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_finish) *
                           (long)*(char **)(local_998._136_8_ + 0x10)) * 8) +
                         *(double *)
                          (&(((FB *)(&(*(FB **)local_998._136_8_)->m_crse_ratio + -3))->
                            super_CommMetaData).m_threadsafe_loc +
                          ((long)(local_b9c -
                                 *(int *)&(((Vector<int,_std::allocator<int>_> *)
                                           (local_998._136_8_ + 0x20))->
                                          super_vector<int,_std::allocator<int>_>).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start) +
                           (long)(local_340 -
                                 *(int *)((long)&(((Vector<int,_std::allocator<int>_> *)
                                                  (local_998._136_8_ + 0x20))->
                                                 super_vector<int,_std::allocator<int>_>).
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start + 4)) *
                           *(long *)(local_998._136_8_ + 8) +
                          (long)(local_b94 -
                                *(int *)&(((Vector<int,_std::allocator<int>_> *)
                                          (local_998._136_8_ + 0x20))->
                                         super_vector<int,_std::allocator<int>_>).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_finish) *
                          (long)*(char **)(local_998._136_8_ + 0x10)) * 8)) * 0.5;
                  }
                  else {
                    local_308 = (FBData<amrex::CutFab> *)local_998._136_8_;
                    local_30c = local_b9c;
                    local_310 = local_b98;
                    local_314 = local_b94;
                    local_498 = local_794 + 1;
                    local_488 = local_880;
                    local_48c = local_b9c;
                    local_490 = local_b98;
                    local_494 = local_b94;
                    *(undefined8 *)
                     (*local_880 +
                     ((long)(local_b9c - (int)local_880[4]) +
                      (long)(local_b98 - *(int *)((long)local_880 + 0x24)) * local_880[1] +
                      (long)(local_b94 - (int)local_880[5]) * local_880[2] +
                     (long)local_498 * local_880[3]) * 8) =
                         *(undefined8 *)
                          (&(((FB *)(&(*(FB **)local_998._136_8_)->m_crse_ratio + -3))->
                            super_CommMetaData).m_threadsafe_loc +
                          ((long)(local_b9c -
                                 *(int *)&(((Vector<int,_std::allocator<int>_> *)
                                           (local_998._136_8_ + 0x20))->
                                          super_vector<int,_std::allocator<int>_>).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start) +
                           (long)(local_b98 -
                                 *(int *)((long)&(((Vector<int,_std::allocator<int>_> *)
                                                  (local_998._136_8_ + 0x20))->
                                                 super_vector<int,_std::allocator<int>_>).
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start + 4)) *
                           *(long *)(local_998._136_8_ + 8) +
                          (long)(local_b94 -
                                *(int *)&(((Vector<int,_std::allocator<int>_> *)
                                          (local_998._136_8_ + 0x20))->
                                         super_vector<int,_std::allocator<int>_>).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_finish) *
                          (long)*(char **)(local_998._136_8_ + 0x10)) * 8);
                  }
                }
                else {
                  local_2e0 = local_b98 + 1;
                  local_2d8 = (FBData<amrex::CutFab> *)local_998._136_8_;
                  local_2dc = local_b9c;
                  local_2e4 = local_b94;
                  local_480 = local_794 + 1;
                  local_470 = local_880;
                  local_474 = local_b9c;
                  local_478 = local_b98;
                  local_47c = local_b94;
                  *(undefined8 *)
                   (*local_880 +
                   ((long)(local_b9c - (int)local_880[4]) +
                    (long)(local_b98 - *(int *)((long)local_880 + 0x24)) * local_880[1] +
                    (long)(local_b94 - (int)local_880[5]) * local_880[2] +
                   (long)local_480 * local_880[3]) * 8) =
                       *(undefined8 *)
                        (&(((FB *)(&(*(FB **)local_998._136_8_)->m_crse_ratio + -3))->
                          super_CommMetaData).m_threadsafe_loc +
                        ((long)(local_b9c -
                               *(int *)&(((Vector<int,_std::allocator<int>_> *)
                                         (local_998._136_8_ + 0x20))->
                                        super_vector<int,_std::allocator<int>_>).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start) +
                         (long)(local_2e0 -
                               *(int *)((long)&(((Vector<int,_std::allocator<int>_> *)
                                                (local_998._136_8_ + 0x20))->
                                               super_vector<int,_std::allocator<int>_>).
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start + 4)) *
                         *(long *)(local_998._136_8_ + 8) +
                        (long)(local_b94 -
                              *(int *)&(((Vector<int,_std::allocator<int>_> *)
                                        (local_998._136_8_ + 0x20))->
                                       super_vector<int,_std::allocator<int>_>).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish) *
                        (long)*(char **)(local_998._136_8_ + 0x10)) * 8);
                }
                local_350 = local_ac8;
                local_354 = local_b9c;
                local_358 = local_b98;
                local_35c = local_b94;
                dVar1 = *(double *)
                         (*local_ac8 +
                         ((long)(local_b9c - (int)local_ac8[4]) +
                          (long)(local_b98 - *(int *)((long)local_ac8 + 0x24)) * local_ac8[1] +
                         (long)(local_b94 - (int)local_ac8[5]) * local_ac8[2]) * 8);
                local_2c0 = pFVar6;
                if ((dVar1 != 0.0) || (NAN(dVar1))) {
                  local_38c = local_b94 + 1;
                  local_380 = local_ac8;
                  local_384 = local_b9c;
                  local_388 = local_b98;
                  dVar1 = *(double *)
                           (*local_ac8 +
                           ((long)(local_b9c - (int)local_ac8[4]) +
                            (long)(local_b98 - *(int *)((long)local_ac8 + 0x24)) * local_ac8[1] +
                           (long)(local_38c - (int)local_ac8[5]) * local_ac8[2]) * 8);
                  if ((dVar1 != 0.0) || (NAN(dVar1))) {
                    local_3b0 = (FBData<amrex::FArrayBox> *)local_998._64_8_;
                    local_3b4 = local_b9c;
                    local_3b8 = local_b98;
                    local_3bc = local_b94;
                    local_3d4 = local_b94 + 1;
                    local_3c8 = (FBData<amrex::FArrayBox> *)local_998._64_8_;
                    local_3cc = local_b9c;
                    local_3d0 = local_b98;
                    local_4f8 = local_794 + 2;
                    local_4e8 = local_880;
                    local_4ec = local_b9c;
                    local_4f0 = local_b98;
                    local_4f4 = local_b94;
                    *(double *)
                     (*local_880 +
                     ((long)(local_b9c - (int)local_880[4]) +
                      (long)(local_b98 - *(int *)((long)local_880 + 0x24)) * local_880[1] +
                      (long)(local_b94 - (int)local_880[5]) * local_880[2] +
                     (long)local_4f8 * local_880[3]) * 8) =
                         (*(double *)
                           (&(((FB *)(&(*(FB **)local_998._64_8_)->m_crse_ratio + -3))->
                             super_CommMetaData).m_threadsafe_loc +
                           ((long)(local_b9c -
                                  *(int *)&(((Vector<int,_std::allocator<int>_> *)
                                            (local_998._64_8_ + 0x20))->
                                           super_vector<int,_std::allocator<int>_>).
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_start) +
                            (long)(local_b98 -
                                  *(int *)((long)&(((Vector<int,_std::allocator<int>_> *)
                                                   (local_998._64_8_ + 0x20))->
                                                  super_vector<int,_std::allocator<int>_>).
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start + 4)) *
                            *(long *)(local_998._64_8_ + 8) +
                           (long)(local_b94 -
                                 *(int *)&(((Vector<int,_std::allocator<int>_> *)
                                           (local_998._64_8_ + 0x20))->
                                          super_vector<int,_std::allocator<int>_>).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_finish) *
                           (long)*(char **)(local_998._64_8_ + 0x10)) * 8) +
                         *(double *)
                          (&(((FB *)(&(*(FB **)local_998._64_8_)->m_crse_ratio + -3))->
                            super_CommMetaData).m_threadsafe_loc +
                          ((long)(local_b9c -
                                 *(int *)&(((Vector<int,_std::allocator<int>_> *)
                                           (local_998._64_8_ + 0x20))->
                                          super_vector<int,_std::allocator<int>_>).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start) +
                           (long)(local_b98 -
                                 *(int *)((long)&(((Vector<int,_std::allocator<int>_> *)
                                                  (local_998._64_8_ + 0x20))->
                                                 super_vector<int,_std::allocator<int>_>).
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start + 4)) *
                           *(long *)(local_998._64_8_ + 8) +
                          (long)(local_3d4 -
                                *(int *)&(((Vector<int,_std::allocator<int>_> *)
                                          (local_998._64_8_ + 0x20))->
                                         super_vector<int,_std::allocator<int>_>).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_finish) *
                          (long)*(char **)(local_998._64_8_ + 0x10)) * 8)) * 0.5;
                  }
                  else {
                    local_398 = (FBData<amrex::FArrayBox> *)local_998._64_8_;
                    local_39c = local_b9c;
                    local_3a0 = local_b98;
                    local_3a4 = local_b94;
                    local_4e0 = local_794 + 2;
                    local_4d0 = local_880;
                    local_4d4 = local_b9c;
                    local_4d8 = local_b98;
                    local_4dc = local_b94;
                    *(undefined8 *)
                     (*local_880 +
                     ((long)(local_b9c - (int)local_880[4]) +
                      (long)(local_b98 - *(int *)((long)local_880 + 0x24)) * local_880[1] +
                      (long)(local_b94 - (int)local_880[5]) * local_880[2] +
                     (long)local_4e0 * local_880[3]) * 8) =
                         *(undefined8 *)
                          (&(((FB *)(&(*(FB **)local_998._64_8_)->m_crse_ratio + -3))->
                            super_CommMetaData).m_threadsafe_loc +
                          ((long)(local_b9c -
                                 *(int *)&(((Vector<int,_std::allocator<int>_> *)
                                           (local_998._64_8_ + 0x20))->
                                          super_vector<int,_std::allocator<int>_>).
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start) +
                           (long)(local_b98 -
                                 *(int *)((long)&(((Vector<int,_std::allocator<int>_> *)
                                                  (local_998._64_8_ + 0x20))->
                                                 super_vector<int,_std::allocator<int>_>).
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start + 4)) *
                           *(long *)(local_998._64_8_ + 8) +
                          (long)(local_b94 -
                                *(int *)&(((Vector<int,_std::allocator<int>_> *)
                                          (local_998._64_8_ + 0x20))->
                                         super_vector<int,_std::allocator<int>_>).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_finish) *
                          (long)*(char **)(local_998._64_8_ + 0x10)) * 8);
                  }
                }
                else {
                  local_374 = local_b94 + 1;
                  local_368 = (FBData<amrex::FArrayBox> *)local_998._64_8_;
                  local_36c = local_b9c;
                  local_370 = local_b98;
                  local_4c8 = local_794 + 2;
                  local_4b8 = local_880;
                  local_4bc = local_b9c;
                  local_4c0 = local_b98;
                  local_4c4 = local_b94;
                  *(undefined8 *)
                   (*local_880 +
                   ((long)(local_b9c - (int)local_880[4]) +
                    (long)(local_b98 - *(int *)((long)local_880 + 0x24)) * local_880[1] +
                    (long)(local_b94 - (int)local_880[5]) * local_880[2] +
                   (long)local_4c8 * local_880[3]) * 8) =
                       *(undefined8 *)
                        (&(((FB *)(&(*(FB **)local_998._64_8_)->m_crse_ratio + -3))->
                          super_CommMetaData).m_threadsafe_loc +
                        ((long)(local_b9c -
                               *(int *)&(((Vector<int,_std::allocator<int>_> *)
                                         (local_998._64_8_ + 0x20))->
                                        super_vector<int,_std::allocator<int>_>).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start) +
                         (long)(local_b98 -
                               *(int *)((long)&(((Vector<int,_std::allocator<int>_> *)
                                                (local_998._64_8_ + 0x20))->
                                               super_vector<int,_std::allocator<int>_>).
                                               super__Vector_base<int,_std::allocator<int>_>._M_impl
                                               .super__Vector_impl_data._M_start + 4)) *
                         *(long *)(local_998._64_8_ + 8) +
                        (long)(local_374 -
                              *(int *)&(((Vector<int,_std::allocator<int>_> *)
                                        (local_998._64_8_ + 0x20))->
                                       super_vector<int,_std::allocator<int>_>).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish) *
                        (long)*(char **)(local_998._64_8_ + 0x10)) * 8);
                }
              }
              local_568 = this_00;
              local_558 = pFVar6;
              local_508 = this_00;
            }
          }
        }
      }
      MFIter::operator++(&local_848);
    }
    MFIter::~MFIter((MFIter *)in_stack_fffffffffffff420);
  }
  else {
    average_face_to_cellcenter
              ((MultiFab *)CONCAT44(in_stack_fffffffffffff654,in_stack_fffffffffffff650),iVar7,
               (Array<const_MultiFab_*,_3> *)
               CONCAT44(in_stack_fffffffffffff644,in_stack_fffffffffffff640),
               in_stack_fffffffffffff63c);
  }
  return;
}

Assistant:

void
EB_average_face_to_cellcenter (MultiFab& ccmf, int dcomp,
                               const Array<MultiFab const*,AMREX_SPACEDIM>& fmf)
{
    AMREX_ASSERT(ccmf.nComp() >= dcomp + AMREX_SPACEDIM);

    if (!fmf[0]->hasEBFabFactory())
    {
        average_face_to_cellcenter(ccmf, dcomp, fmf);
    }
    else
    {
        const auto& factory = dynamic_cast<EBFArrayBoxFactory const&>(fmf[0]->Factory());
        const auto& flags = factory.getMultiEBCellFlagFab();
        const auto& area = factory.getAreaFrac();

        MFItInfo info;
        if (Gpu::notInLaunchRegion()) info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(ccmf,info); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            const auto& flagfab = flags[mfi];
            Array4<Real> const& ccfab = ccmf.array(mfi);
            AMREX_D_TERM(Array4<Real const> const& xfab = fmf[0]->const_array(mfi);,
                         Array4<Real const> const& yfab = fmf[1]->const_array(mfi);,
                         Array4<Real const> const& zfab = fmf[2]->const_array(mfi));
            const auto fabtyp = flagfab.getType(bx);
            if (fabtyp == FabType::covered) {
                AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                {
                    ccfab(i,j,k,dcomp) = 0.0;
                });
            } else if (fabtyp == FabType::regular) {
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                {
                    amrex_avg_fc_to_cc(i,j,k,ccfab,AMREX_D_DECL(xfab,yfab,zfab),dcomp);
                });
            } else {
                AMREX_D_TERM(Array4<Real const> const& apx = area[0]->const_array(mfi);,
                             Array4<Real const> const& apy = area[1]->const_array(mfi);,
                             Array4<Real const> const& apz = area[2]->const_array(mfi));
                Array4<EBCellFlag const> const& flagarr = flagfab.const_array();
                AMREX_HOST_DEVICE_FOR_3D(bx,i,j,k,
                {
                    eb_avg_fc_to_cc(i,j,k,dcomp,ccfab,AMREX_D_DECL(xfab,yfab,zfab),
                                    AMREX_D_DECL(apx,apy,apz),flagarr);
                });
            }
        }
    }
}